

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O2

bool __thiscall
capnp::compiler::NodeTranslator::StructLayout::Union::DataLocation::tryExpandTo
          (DataLocation *this,Union *u,uint newLgSize)

{
  int iVar1;
  bool bVar2;
  
  bVar2 = true;
  if (this->lgSize < newLgSize) {
    iVar1 = (*u->parent->_vptr_StructOrGroup[3])(u->parent,(ulong)this->lgSize,(ulong)this->offset);
    if ((char)iVar1 == '\0') {
      bVar2 = false;
    }
    else {
      this->offset = this->offset >> ((char)newLgSize - (char)this->lgSize & 0x1fU);
      this->lgSize = newLgSize;
    }
  }
  return bVar2;
}

Assistant:

bool tryExpandTo(Union& u, uint newLgSize) {
        if (newLgSize <= lgSize) {
          return true;
        } else if (u.parent.tryExpandData(lgSize, offset, newLgSize - lgSize)) {
          offset >>= (newLgSize - lgSize);
          lgSize = newLgSize;
          return true;
        } else {
          return false;
        }
      }